

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-strutil.cc
# Opt level: O2

void strutil_test(void)

{
  bool bVar1;
  int iVar2;
  string s;
  string ls;
  
  std::__cxx11::string::string((string *)&s,"HelloA WorlZ",(allocator *)&ls);
  tinyusdz::to_lower(&ls,&s);
  iVar2 = std::__cxx11::string::compare((char *)&ls);
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-strutil.cc"
                 ,0x11,"%s","ls.compare(\"helloa worlz\") == 0");
  std::__cxx11::string::~string((string *)&ls);
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::string((string *)&s,"_aaa",(allocator *)&ls);
  bVar1 = tinyusdz::is_valid_utf8_identifier(&s);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-strutil.cc"
                 ,0x16,"%s","is_valid_utf8_identifier(s)");
  std::__cxx11::string::assign((char *)&s);
  bVar1 = tinyusdz::is_valid_utf8_identifier(&s);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-strutil.cc"
                 ,0x1a,"%s","is_valid_utf8_identifier(s)");
  std::__cxx11::string::assign((char *)&s);
  bVar1 = tinyusdz::isValidIdentifier(&s,true);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-strutil.cc"
                 ,0x1d,"%s","isValidIdentifier(s)");
  std::__cxx11::string::assign((char *)&s);
  bVar1 = tinyusdz::isValidIdentifier(&s,true);
  acutest_check_((uint)bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-strutil.cc"
                 ,0x21,"%s","isValidIdentifier(s)");
  std::__cxx11::string::assign((char *)&s);
  bVar1 = tinyusdz::isValidIdentifier(&s,true);
  acutest_check_((uint)!bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-strutil.cc"
                 ,0x25,"%s","!isValidIdentifier(s)");
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void strutil_test(void) {
  {
    std::string s = "HelloA WorlZ";
    std::string ls = tinyusdz::to_lower(s);
    TEST_CHECK(ls.compare("helloa worlz") == 0);
  }

  {
    std::string s = "_aaa";
    TEST_CHECK(is_valid_utf8_identifier(s));

    // TODO: Do not allow underscore-only identifier?
    s = "___";
    TEST_CHECK(is_valid_utf8_identifier(s));

    s = "customLayerData";
    TEST_CHECK(isValidIdentifier(s));

    // Now TinyUSDZ allow UTF-8 string as identifier by default.
    s = u8"響";
    TEST_CHECK(isValidIdentifier(s));

    // Emoji in identifier is not allowed.
    s = u8"_hello😩";
    TEST_CHECK(!isValidIdentifier(s));

  }
}